

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionBlocker.cxx
# Opt level: O3

bool __thiscall
cmFunctionBlocker::IsFunctionBlocked
          (cmFunctionBlocker *this,cmListFileFunction *lff,cmExecutionStatus *status)

{
  uint *puVar1;
  element_type *peVar2;
  pointer pcVar3;
  size_t sVar4;
  cmMakefile *this_00;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar6;
  void *__s2;
  void *__s2_00;
  size_type __rlen;
  cmListFileContext closingContext;
  ostringstream e;
  string local_278;
  undefined1 local_258 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> local_228;
  cmListFileContext local_210;
  undefined1 local_1a0 [376];
  
  peVar2 = (lff->Impl).
           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar3 = (peVar2->LowerCaseName)._M_dataplus._M_p;
  sVar4 = (peVar2->LowerCaseName)._M_string_length;
  iVar5 = (*this->_vptr_cmFunctionBlocker[2])();
  if ((sVar4 == CONCAT44(extraout_var,iVar5)) &&
     ((sVar4 == 0 || (iVar5 = bcmp(pcVar3,__s2,sVar4), iVar5 == 0)))) {
    this->ScopeDepth = this->ScopeDepth + 1;
LAB_0037f1b7:
    std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
              (&this->Functions,lff);
    return true;
  }
  peVar2 = (lff->Impl).
           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar3 = (peVar2->LowerCaseName)._M_dataplus._M_p;
  sVar4 = (peVar2->LowerCaseName)._M_string_length;
  iVar5 = (*this->_vptr_cmFunctionBlocker[3])(this);
  if ((sVar4 != CONCAT44(extraout_var_00,iVar5)) ||
     ((sVar4 != 0 && (iVar5 = bcmp(pcVar3,__s2_00,sVar4), iVar5 != 0)))) goto LAB_0037f1b7;
  puVar1 = &this->ScopeDepth;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) goto LAB_0037f1b7;
  this_00 = status->Makefile;
  cmMakefile::RemoveFunctionBlocker((cmMakefile *)local_258);
  if (local_258 != (undefined1  [8])this) {
    __assert_fail("self.get() == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFunctionBlocker.cxx"
                  ,0x19,
                  "bool cmFunctionBlocker::IsFunctionBlocked(const cmListFileFunction &, cmExecutionStatus &)"
                 );
  }
  local_250.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  cmListFileContext::FromListFileFunction
            (&local_210,lff,&(this->StartingContext).FilePath,&local_250);
  if ((local_250.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (local_250.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false,
     local_250.
     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ._M_payload._M_value._M_dataplus._M_p !=
     (pointer)((long)&local_250.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x10))) {
    operator_delete((void *)local_250.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    (ulong)(local_250.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._16_8_ + 1));
  }
  iVar5 = (*this->_vptr_cmFunctionBlocker[4])(this);
  if (((char)iVar5 == '\0') ||
     (iVar5 = (*this->_vptr_cmFunctionBlocker[5])(this,lff,this_00), (char)iVar5 != '\0')) {
    iVar5 = (*this->_vptr_cmFunctionBlocker[4])(this);
    if (((char)iVar5 != '\0') ||
       (peVar2 = (lff->Impl).
                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,
       (peVar2->Arguments).
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (peVar2->Arguments).
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_finish)) goto LAB_0037f2fb;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"A logical block closing on the line\n  ",0x26);
    poVar6 = operator<<((ostream *)local_1a0,&local_210);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nhas unexpected arguments.",0x1a);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_278);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"A logical block opening on the line\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"  ",2);
    poVar6 = operator<<((ostream *)local_1a0,&this->StartingContext);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"closes on the line\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
    poVar6 = operator<<(poVar6,&local_210);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"with mis-matching arguments.",0x1c);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_278);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
LAB_0037f2fb:
  local_228.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_228.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_228.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = (*this->_vptr_cmFunctionBlocker[6])(this,&local_228,status);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_228);
  if ((local_210.DeferId.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (local_210.DeferId.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false,
     local_210.DeferId.
     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ._M_payload._M_value._M_dataplus._M_p !=
     (pointer)((long)&local_210.DeferId.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x10))) {
    operator_delete((void *)local_210.DeferId.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    local_210.DeferId.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.FilePath._M_dataplus._M_p != &local_210.FilePath.field_2) {
    operator_delete(local_210.FilePath._M_dataplus._M_p,
                    local_210.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.Name._M_dataplus._M_p != &local_210.Name.field_2) {
    operator_delete(local_210.Name._M_dataplus._M_p,local_210.Name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_258 == (undefined1  [8])0x0) {
    return (bool)(char)iVar5;
  }
  (*(*(_func_int ***)local_258)[1])();
  return (bool)(char)iVar5;
}

Assistant:

bool cmFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                          cmExecutionStatus& status)
{
  if (lff.LowerCaseName() == this->StartCommandName()) {
    this->ScopeDepth++;
  } else if (lff.LowerCaseName() == this->EndCommandName()) {
    this->ScopeDepth--;
    if (this->ScopeDepth == 0U) {
      cmMakefile& mf = status.GetMakefile();
      auto self = mf.RemoveFunctionBlocker();
      assert(self.get() == this);

      cmListFileContext const& lfc = this->GetStartingContext();
      cmListFileContext closingContext =
        cmListFileContext::FromListFileFunction(lff, lfc.FilePath);
      if (this->EndCommandSupportsArguments() &&
          !this->ArgumentsMatch(lff, mf)) {
        std::ostringstream e;
        /* clang-format off */
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << closingContext << "\n"
          << "with mis-matching arguments.";
        /* clang-format on */
        mf.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      } else if (!this->EndCommandSupportsArguments() &&
                 !lff.Arguments().empty()) {
        std::ostringstream e;
        /* clang-format off */
        e << "A logical block closing on the line\n"
          "  " << closingContext << "\n"
          "has unexpected arguments.";
        /* clang-format on */
        mf.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }

      return this->Replay(std::move(this->Functions), status);
    }
  }

  this->Functions.push_back(lff);
  return true;
}